

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::set_super_seeding(torrent *this,bool on)

{
  byte bVar1;
  pointer pppVar2;
  pointer pppVar3;
  
  if (((this->field_0x5cc & 8) == 0) == on) {
    this->field_0x5cc = this->field_0x5cc & 0xf7 | on << 3;
    bVar1 = (this->m_need_save_resume_data).m_val;
    if ((bVar1 & 0x40) == 0) {
      (this->m_need_save_resume_data).m_val = bVar1 | 0x40;
      state_updated(this);
    }
    state_updated(this);
    if ((this->field_0x5cc & 8) == 0) {
      pppVar2 = (this->super_torrent_hot_members).m_connections.
                super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                .
                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pppVar3 = (this->super_torrent_hot_members).m_connections.
                     super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     .
                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; pppVar3 != pppVar2;
          pppVar3 = pppVar3 + 1) {
        peer_connection::superseed_piece
                  (*pppVar3,(piece_index_t)0xffffffff,(piece_index_t)0xffffffff);
      }
    }
  }
  return;
}

Assistant:

void torrent::set_super_seeding(bool const on)
	{
		if (on == m_super_seeding) return;

		m_super_seeding = on;
		set_need_save_resume(torrent_handle::if_state_changed);
		state_updated();

		if (m_super_seeding) return;

		// disable super seeding for all peers
		for (auto* pc : *this)
		{
			pc->superseed_piece(piece_index_t(-1), piece_index_t(-1));
		}
	}